

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O2

bool __thiscall sf::VertexBuffer::create(VertexBuffer *this,size_t vertexCount)

{
  bool bVar1;
  ostream *poVar2;
  GLenum GVar3;
  GLuint GVar4;
  TransientContextLock contextLock;
  
  bVar1 = isAvailable();
  if (!bVar1) {
    return false;
  }
  GlResource::TransientContextLock::TransientContextLock(&contextLock);
  GVar4 = this->m_buffer;
  if (GVar4 == 0) {
    (*sf_ptrc_glGenBuffersARB)(1,&this->m_buffer);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/VertexBuffer.cpp"
                       ,0x89,"GLEXT_glGenBuffers(1, &m_buffer)");
    GVar4 = this->m_buffer;
    if (GVar4 == 0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Could not create vertex buffer, generation failed");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = false;
      goto LAB_0012ed13;
    }
  }
  (*sf_ptrc_glBindBufferARB)(0x8892,GVar4);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/VertexBuffer.cpp"
                     ,0x91,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer)");
  GVar3 = 0x88e4;
  if (this->m_usage != Static) {
    GVar3 = (uint)(this->m_usage == Dynamic) * 8 + 0x88e0;
  }
  (*sf_ptrc_glBufferDataARB)(0x8892,vertexCount * 0x14,(void *)0x0,GVar3);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/VertexBuffer.cpp"
                     ,0x92,
                     "GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage))"
                    );
  (*sf_ptrc_glBindBufferARB)(0x8892,0);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/VertexBuffer.cpp"
                     ,0x93,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0)");
  this->m_size = vertexCount;
  bVar1 = true;
LAB_0012ed13:
  GlResource::TransientContextLock::~TransientContextLock(&contextLock);
  return bVar1;
}

Assistant:

bool VertexBuffer::create(std::size_t vertexCount)
{
    if (!isAvailable())
        return false;

    TransientContextLock contextLock;

    if (!m_buffer)
        glCheck(GLEXT_glGenBuffers(1, &m_buffer));

    if (!m_buffer)
    {
        err() << "Could not create vertex buffer, generation failed" << std::endl;
        return false;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage)));
    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    m_size = vertexCount;

    return true;
}